

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunchReporter.cxx
# Opt level: O2

void __thiscall cmCTestLaunchReporter::WriteXML(cmCTestLaunchReporter *this)

{
  char *pcVar1;
  bool bVar2;
  cmXMLElement e2;
  char *local_2f8;
  string logXML;
  cmXMLWriter xml;
  cmGeneratedFileStream fxml;
  
  fxml.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       (this->LogDir)._M_dataplus._M_p;
  fxml.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)(this->LogDir)._M_string_length;
  bVar2 = this->ExitCode == 0;
  pcVar1 = "error-";
  if (bVar2) {
    pcVar1 = "warning-";
  }
  xml.Output = (ostream *)((ulong)bVar2 * 2 + 6);
  xml.Elements.c.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pcVar1;
  cmStrCat<std::__cxx11::string,char[5]>
            (&logXML,(cmAlphaNum *)&fxml,(cmAlphaNum *)&xml,&this->LogHash,(char (*) [5])0x600bab);
  cmGeneratedFileStream::cmGeneratedFileStream(&fxml,&logXML,false,None);
  cmXMLWriter::cmXMLWriter(&xml,(ostream *)&fxml,2);
  cmXMLElement::cmXMLElement(&e2,&xml,"Failure");
  local_2f8 = "Error";
  if (this->ExitCode == 0) {
    local_2f8 = "Warning";
  }
  cmXMLWriter::Attribute<char_const*>(e2.xmlwr,"type",&local_2f8);
  WriteXMLAction(this,&e2);
  WriteXMLCommand(this,&e2);
  WriteXMLResult(this,&e2);
  WriteXMLLabels(this,&e2);
  cmXMLElement::~cmXMLElement(&e2);
  cmXMLWriter::~cmXMLWriter(&xml);
  cmGeneratedFileStream::~cmGeneratedFileStream(&fxml);
  std::__cxx11::string::~string((string *)&logXML);
  return;
}

Assistant:

void cmCTestLaunchReporter::WriteXML()
{
  // Name the xml file.
  std::string logXML =
    cmStrCat(this->LogDir, this->IsError() ? "error-" : "warning-",
             this->LogHash, ".xml");

  // Use cmGeneratedFileStream to atomically create the report file.
  cmGeneratedFileStream fxml(logXML);
  cmXMLWriter xml(fxml, 2);
  cmXMLElement e2(xml, "Failure");
  e2.Attribute("type", this->IsError() ? "Error" : "Warning");
  this->WriteXMLAction(e2);
  this->WriteXMLCommand(e2);
  this->WriteXMLResult(e2);
  this->WriteXMLLabels(e2);
}